

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O0

void Tas_ManDeriveReason(Tas_Man_t *p,int Level)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  Tas_Que_t *p_00;
  Tas_Cls_t *pTVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  ulong *puVar6;
  Tas_Cls_t *pCls;
  int iLitLevel2;
  int iLitLevel;
  int j;
  int k;
  int i;
  Gia_Obj_t *pReason;
  Gia_Obj_t *pObj;
  Tas_Que_t *pQue;
  int Level_local;
  Tas_Man_t *p_local;
  
  p_00 = &p->pClauses;
  if ((p->pClauses).pData[p_00->iHead] != (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[pQue->iHead] == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x2f9,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
  }
  if ((p->pClauses).iTail <= p_00->iHead + 1) {
    __assert_fail("pQue->iHead + 1 < pQue->iTail",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                  ,0x2fa,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
  }
  Vec_PtrClear(p->vTemp);
  iLitLevel = p_00->iHead + 1;
  j = iLitLevel;
  do {
    if ((p->pClauses).iTail <= j) {
      if ((p->pClauses).pData[p_00->iHead] != (Gia_Obj_t *)0x0) {
        if ((p->pClauses).pData[p_00->iHead] == (Gia_Obj_t *)0x0) {
          printf("Tas_ManDeriveReason(): Failed to derive the clause!!!\n");
        }
        (p->pClauses).iTail = iLitLevel;
        for (j = 0; iVar2 = Vec_PtrSize(p->vTemp), j < iVar2; j = j + 1) {
          puVar6 = (ulong *)Vec_PtrEntry(p->vTemp,j);
          *puVar6 = *puVar6 & 0x7fffffffffffffff;
        }
        return;
      }
      __assert_fail("pQue->pData[pQue->iHead] != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                    ,0x339,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
    }
    pGVar5 = (p->pClauses).pData[j];
    if (-1 < *(long *)pGVar5) {
      *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0x7fffffffffffffff | 0x8000000000000000;
      Vec_PtrPush(p->vTemp,pGVar5);
      iVar2 = Tas_VarDecLevel(p,pGVar5);
      if (iVar2 < Level) {
        (p->pClauses).pData[iLitLevel] = pGVar5;
        iLitLevel = iLitLevel + 1;
      }
      else {
        if (iVar2 != Level) {
          __assert_fail("iLitLevel == Level",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                        ,0x318,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
        }
        iVar2 = Tas_VarHasReasonCls(p,pGVar5);
        if (iVar2 == 0) {
          pGVar4 = Tas_VarReason0(p,pGVar5);
          if (pGVar4 == pGVar5) {
            if (((p->pClauses).pData[p_00->iHead] != (Gia_Obj_t *)0x0) && (Level != 0)) {
              __assert_fail("pQue->pData[pQue->iHead] == NULL || Level == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                            ,0x32c,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
            }
            if ((p->pClauses).pData[p_00->iHead] == (Gia_Obj_t *)0x0) {
              (p->pClauses).pData[p_00->iHead] = pGVar5;
            }
            else {
              Tas_QuePush(p_00,pGVar5);
            }
          }
          else {
            Tas_QuePush(p_00,pGVar4);
            pGVar4 = Tas_VarReason1(p,pGVar5);
            if (pGVar4 != pGVar5) {
              Tas_QuePush(p_00,pGVar4);
            }
          }
        }
        else {
          pTVar3 = Tas_VarReasonCls(p,pGVar5);
          pGVar1 = p->pAig;
          iVar2 = Abc_Lit2Var(pTVar3[1].iNext[0]);
          pGVar4 = Gia_ManObj(pGVar1,iVar2);
          if (pGVar4 != pGVar5) {
            __assert_fail("pReason == pObj",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                          ,0x31d,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
          }
          for (iLitLevel2 = 1; iLitLevel2 < pTVar3->nLits; iLitLevel2 = iLitLevel2 + 1) {
            pGVar1 = p->pAig;
            iVar2 = Abc_Lit2Var(pTVar3[1].iNext[iLitLevel2]);
            pGVar5 = Gia_ManObj(pGVar1,iVar2);
            Tas_VarDecLevel(p,pGVar5);
            iVar2 = Tas_VarIsAssigned(pGVar5);
            if (iVar2 == 0) {
              __assert_fail("Tas_VarIsAssigned( pReason )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                            ,0x322,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
            }
            iVar2 = Tas_LitIsTrue(pGVar5,pTVar3[1].iNext[iLitLevel2]);
            if (iVar2 != 0) {
              __assert_fail("!Tas_LitIsTrue( pReason, pCls->pLits[j] )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCTas.c"
                            ,0x323,"void Tas_ManDeriveReason(Tas_Man_t *, int)");
            }
            Tas_QuePush(p_00,pGVar5);
          }
        }
      }
    }
    j = j + 1;
  } while( true );
}

Assistant:

static inline void Tas_ManDeriveReason( Tas_Man_t * p, int Level )
{
    Tas_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj, * pReason;
    int i, k, j, iLitLevel, iLitLevel2;//, Id;
    assert( pQue->pData[pQue->iHead] == NULL );
    assert( pQue->iHead + 1 < pQue->iTail );
/*
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        assert( pObj->fPhase == 0 );
    }
*/
    // compact literals
    Vec_PtrClear( p->vTemp );
    for ( i = k = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        if ( pObj->fPhase ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fPhase = 1;
        Vec_PtrPush( p->vTemp, pObj );
        // bump activity
//        Id = Gia_ObjId( p->pAig, pObj );
//        if ( p->pActivity[Id] == 0.0 )
//            Vec_IntPush( p->vActiveVars, Id );
//        p->pActivity[Id] += p->Pars.VarInc;
        // check decision level
        iLitLevel = Tas_VarDecLevel( p, pObj );
        if ( iLitLevel < Level )
        {
            pQue->pData[k++] = pObj;
            continue;
        }
        assert( iLitLevel == Level );
        if ( Tas_VarHasReasonCls( p, pObj ) )
        {
            Tas_Cls_t * pCls = Tas_VarReasonCls( p, pObj );
            pReason = Gia_ManObj( p->pAig, Abc_Lit2Var(pCls->pLits[0]) );
            assert( pReason == pObj );
            for ( j = 1; j < pCls->nLits; j++ )
            {
                pReason = Gia_ManObj( p->pAig, Abc_Lit2Var(pCls->pLits[j]) );
                iLitLevel2 = Tas_VarDecLevel( p, pReason );
                assert( Tas_VarIsAssigned( pReason ) );
                assert( !Tas_LitIsTrue( pReason, pCls->pLits[j] ) );
                Tas_QuePush( pQue, pReason );
            }
        }
        else
        {
            pReason = Tas_VarReason0( p, pObj );
            if ( pReason == pObj ) // no reason
            {
                assert( pQue->pData[pQue->iHead] == NULL || Level == 0 );
                if ( pQue->pData[pQue->iHead] == NULL )
                    pQue->pData[pQue->iHead] = pObj;
                else
                    Tas_QuePush( pQue, pObj );
                continue;
            }
            Tas_QuePush( pQue, pReason );
            pReason = Tas_VarReason1( p, pObj );
            if ( pReason != pObj ) // second reason
                Tas_QuePush( pQue, pReason );
        }
    }
    assert( pQue->pData[pQue->iHead] != NULL );
    if ( pQue->pData[pQue->iHead] == NULL )
        printf( "Tas_ManDeriveReason(): Failed to derive the clause!!!\n" );
    pQue->iTail = k;
    // clear the marks
    Vec_PtrForEachEntry( Gia_Obj_t *, p->vTemp, pObj, i )
        pObj->fPhase = 0;
}